

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O1

bool __thiscall
CLI::App::_parse_ini
          (App *this,vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer piVar2;
  pointer puVar3;
  App *this_00;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  __last;
  Option *pOVar4;
  pointer pbVar5;
  pointer pcVar6;
  bool bVar7;
  int iVar8;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var9;
  unsigned_long uVar10;
  INIError *__return_storage_ptr__;
  ConversionError *pCVar11;
  pointer puVar12;
  undefined1 auVar13 [12];
  string val;
  string parent;
  string name;
  string local_178;
  vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *local_158;
  undefined1 *local_150;
  long local_148;
  undefined1 local_140 [8];
  undefined8 uStack_138;
  undefined1 *local_130;
  long local_128;
  undefined1 local_120 [8];
  undefined8 uStack_118;
  string local_110;
  anon_class_32_1_898f2789_for__M_pred local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  piVar2 = (args->
           super__Vector_base<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  local_158 = args;
  detail::ini_ret_t::parent_abi_cxx11_(&local_110,piVar2 + -1);
  detail::ini_ret_t::name_abi_cxx11_(&local_b0,piVar2 + -1);
  if (local_110._M_string_length == 0) {
    _Var9._M_current =
         (this->options_).
         super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (this->options_).
         super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    paVar1 = &local_f0.name.field_2;
    local_f0.name._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,local_b0._M_dataplus._M_p,
               local_b0._M_dataplus._M_p + local_b0._M_string_length);
    _Var9 = ::std::
            find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_ini(std::vector<CLI::detail::ini_ret_t,std::allocator<CLI::detail::ini_ret_t>>&)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                      (_Var9,__last,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0.name._M_dataplus._M_p);
    }
    bVar7 = _Var9._M_current !=
            (this->options_).
            super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    if (bVar7) {
      pOVar4 = ((_Var9._M_current)->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      if ((pOVar4->super_OptionBase<CLI::Option>).configurable_ == false) {
        __return_storage_ptr__ = (INIError *)__cxa_allocate_exception(0x38);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar6 = piVar2[-1].fullname._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar6,pcVar6 + piVar2[-1].fullname._M_string_length);
        INIError::NotConfigurable(__return_storage_ptr__,&local_50);
        __cxa_throw(__return_storage_ptr__,&INIError::typeinfo,Error::~Error);
      }
      if (*(pointer *)
           &(pOVar4->results_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl ==
          *(pointer *)
           ((long)&(pOVar4->results_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           + 8)) {
        if (pOVar4->expected_ == 0) {
          if ((long)piVar2[-1].inputs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)piVar2[-1].inputs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != 0x20) {
            pCVar11 = (ConversionError *)__cxa_allocate_exception(0x38);
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            pcVar6 = piVar2[-1].fullname._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,pcVar6,pcVar6 + piVar2[-1].fullname._M_string_length);
            ConversionError::TooManyInputsFlag(pCVar11,&local_90);
            __cxa_throw(pCVar11,&ConversionError::typeinfo,Error::~Error);
          }
          pbVar5 = piVar2[-1].inputs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (piVar2[-1].inputs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish == pbVar5) {
            auVar13 = ::std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,0,0);
            if (auVar13._8_4_ != 1) {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178._M_dataplus._M_p != &local_178.field_2) {
                operator_delete(local_178._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p != &local_110.field_2) {
                operator_delete(local_110._M_dataplus._M_p);
              }
              _Unwind_Resume(auVar13._0_8_);
            }
            __cxa_begin_catch(auVar13._0_8_);
            pCVar11 = (ConversionError *)__cxa_allocate_exception(0x38);
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            pcVar6 = piVar2[-1].fullname._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,pcVar6,pcVar6 + piVar2[-1].fullname._M_string_length);
            ConversionError::TrueFalse(pCVar11,&local_70);
            __cxa_throw(pCVar11,&ConversionError::typeinfo,Error::~Error);
          }
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          pcVar6 = (pbVar5->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_178,pcVar6,pcVar6 + pbVar5->_M_string_length);
          local_150 = local_140;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_150,local_178._M_dataplus._M_p,
                     local_178._M_dataplus._M_p + local_178._M_string_length);
          ::std::
          transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                    (local_150,local_150 + local_148,local_150);
          if (local_150 == local_140) {
            uStack_118 = uStack_138;
            local_130 = local_120;
          }
          else {
            local_130 = local_150;
          }
          local_128 = local_148;
          local_148 = 0;
          local_140[0] = 0;
          local_150 = local_140;
          ::std::__cxx11::string::operator=((string *)&local_178,(string *)&local_130);
          if (local_130 != local_120) {
            operator_delete(local_130);
          }
          if (local_150 != local_140) {
            operator_delete(local_150);
          }
          iVar8 = ::std::__cxx11::string::compare((char *)&local_178);
          if (((iVar8 == 0) ||
              (iVar8 = ::std::__cxx11::string::compare((char *)&local_178), iVar8 == 0)) ||
             (iVar8 = ::std::__cxx11::string::compare((char *)&local_178), iVar8 == 0)) {
            local_130 = local_120;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_assign_aux<std::__cxx11::string_const*>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &(((_Var9._M_current)->_M_t).
                         super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                         super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->results_,
                       &local_130,&local_110);
            if (local_130 != local_120) {
              operator_delete(local_130);
            }
          }
          else {
            iVar8 = ::std::__cxx11::string::compare((char *)&local_178);
            if (((iVar8 != 0) &&
                (iVar8 = ::std::__cxx11::string::compare((char *)&local_178), iVar8 != 0)) &&
               (iVar8 = ::std::__cxx11::string::compare((char *)&local_178), iVar8 != 0)) {
              for (uVar10 = std::__cxx11::stoul(&local_178,(size_t *)0x0,10); uVar10 != 0;
                  uVar10 = uVar10 - 1) {
                ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<char_const(&)[1]>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &(((_Var9._M_current)->_M_t).
                             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                             .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->results_,
                           (char (*) [1])0x1150d2);
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p);
          }
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&pOVar4->results_,&piVar2[-1].inputs);
          Option::run_callback
                    (((_Var9._M_current)->_M_t).
                     super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                     super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                     super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
        }
      }
      std::vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>::pop_back
                (local_158);
    }
  }
  else {
    piVar2[-1].level = piVar2[-1].level + 1;
    puVar12 = (this->subcommands_).
              super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->subcommands_).
             super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar12 != puVar3) {
      do {
        this_00 = (puVar12->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>.
                  _M_t.super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                  super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,local_110._M_dataplus._M_p,
                   local_110._M_dataplus._M_p + local_110._M_string_length);
        bVar7 = check_name(this_00,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if (bVar7) {
          bVar7 = _parse_ini((puVar12->_M_t).
                             super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
                             super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                             super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl,local_158);
          goto LAB_0010b9c9;
        }
        puVar12 = puVar12 + 1;
      } while (puVar12 != puVar3);
    }
    bVar7 = false;
  }
LAB_0010b9c9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  return bVar7;
}

Assistant:

bool _parse_ini(std::vector<detail::ini_ret_t> &args) {
        detail::ini_ret_t &current = args.back();
        std::string parent = current.parent(); // respects current.level
        std::string name = current.name();

        // If a parent is listed, go to a subcommand
        if(!parent.empty()) {
            current.level++;
            for(const App_p &com : subcommands_)
                if(com->check_name(parent))
                    return com->_parse_ini(args);
            return false;
        }

        auto op_ptr = std::find_if(
            std::begin(options_), std::end(options_), [name](const Option_p &v) { return v->check_lname(name); });

        if(op_ptr == std::end(options_))
            return false;

        // Let's not go crazy with pointer syntax
        Option_p &op = *op_ptr;

        if(!op->get_configurable())
            throw INIError::NotConfigurable(current.fullname);

        if(op->results_.empty()) {
            // Flag parsing
            if(op->get_expected() == 0) {
                if(current.inputs.size() == 1) {
                    std::string val = current.inputs.at(0);
                    val = detail::to_lower(val);
                    if(val == "true" || val == "on" || val == "yes")
                        op->results_ = {""};
                    else if(val == "false" || val == "off" || val == "no")
                        ;
                    else
                        try {
                            size_t ui = std::stoul(val);
                            for(size_t i = 0; i < ui; i++)
                                op->results_.emplace_back("");
                        } catch(const std::invalid_argument &) {
                            throw ConversionError::TrueFalse(current.fullname);
                        }
                } else
                    throw ConversionError::TooManyInputsFlag(current.fullname);
            } else {
                op->results_ = current.inputs;
                op->run_callback();
            }
        }

        args.pop_back();
        return true;
    }